

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testharness.cc
# Opt level: O2

int leveldb::test::RunAllTests(void)

{
  long lVar1;
  char *__needle;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  allocator local_55;
  uint local_54;
  string name;
  
  __needle = getenv("LEVELDB_TESTS");
  uVar4 = 0;
  if ((anonymous_namespace)::tests != (long *)0x0) {
    lVar3 = 0;
    uVar4 = 0;
    local_54 = 0;
    while( true ) {
      lVar1 = *(anonymous_namespace)::tests;
      if ((ulong)(((anonymous_namespace)::tests[1] - lVar1) / 0x18) <= uVar4) break;
      if (__needle == (char *)0x0) {
LAB_00104a5f:
        fprintf(_stderr,"==== Test %s.%s\n",*(undefined8 *)(lVar1 + lVar3),
                *(undefined8 *)(lVar1 + 8 + lVar3));
        (**(code **)(lVar1 + 0x10 + lVar3))();
        local_54 = local_54 + 1;
      }
      else {
        std::__cxx11::string::string((string *)&name,*(char **)(lVar1 + lVar3),&local_55);
        std::__cxx11::string::push_back((char)&name);
        std::__cxx11::string::append((char *)&name);
        pcVar2 = strstr(name._M_dataplus._M_p,__needle);
        std::__cxx11::string::~string((string *)&name);
        if (pcVar2 != (char *)0x0) goto LAB_00104a5f;
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x18;
    }
    uVar4 = (ulong)local_54;
  }
  fprintf(_stderr,"==== PASSED %d tests\n",uVar4);
  return 0;
}

Assistant:

int RunAllTests() {
  const char* matcher = getenv("LEVELDB_TESTS");

  int num = 0;
  if (tests != nullptr) {
    for (size_t i = 0; i < tests->size(); i++) {
      const Test& t = (*tests)[i];
      if (matcher != nullptr) {
        std::string name = t.base;
        name.push_back('.');
        name.append(t.name);
        if (strstr(name.c_str(), matcher) == nullptr) {
          continue;
        }
      }
      fprintf(stderr, "==== Test %s.%s\n", t.base, t.name);
      (*t.func)();
      ++num;
    }
  }
  fprintf(stderr, "==== PASSED %d tests\n", num);
  return 0;
}